

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  bool local_15;
  char acStack_14 [7];
  bool x;
  char eme [8];
  
  eme[0] = '\0';
  eme[1] = '\0';
  eme[2] = '\0';
  eme[3] = '\0';
  setlocale(6,"");
  _acStack_14 = 0x6d37333b315b1b;
  std::operator<<((ostream *)&std::cout,acStack_14);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6ac);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Nietzsche era antisemita?");
  std::istream::operator>>((istream *)&std::cin,&local_15);
  if ((local_15 & 1U) == 1) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_6d8);
    std::operator<<((ostream *)&std::cout,
                    "Que carecia de superacao. Isso nada tinha haver com os Judeus ");
    poVar1 = std::operator<<((ostream *)&std::cout,"especificamente.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_71a);
    std::operator<<((ostream *)&std::cout,"que era absolutamente preconceituosa e desejava ");
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "a todo custo, associar a imagem dele ao antisemitismo.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Nietzsche acreditava em Deus?");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_15);
  if ((local_15 & 1U) == 1) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_788);
    std::operator<<((ostream *)&std::cout,"O Deus que era constantemente usado para promover  ");
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_7b4);
  }
  else {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_7ca);
    std::operator<<((ostream *)&std::cout,
                    "Estava de Deus. E com isso declarou: \'O ultimo verdadeiro ");
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_7ea);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------------------------------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Nietzsche era Niilista? ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_15);
  if ((local_15 & 1U) == 1) {
    std::operator<<((ostream *)&std::cout,
                    "Nietzsche se considerava Niilista quando partia do pressuposto ");
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_836);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Nos acompanha tambem o amor pela vontade e pela vida, acima de tudo.")
    ;
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Errado. Leia os primeiros capitulos de \'ECCE HOMO\'");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    char eme[] = {0x1b, '[', '1', ';', '3', '7', 'm', 0};
    cout << eme;
    bool x;

    cout << "Responda as alternativas com 1 para sim e 0 para não: " << endl;
    cout << "Nietzsche era antisemita?";
    cin >> x;

    if (x == true)
    {
        cout << "Nooopz! Nietzsche falava que o homem em sí era incompleto. ";
        cout << "Que carecia de superacao. Isso nada tinha haver com os Judeus ";
        cout << "especificamente." << endl;
    }
    else
    {
        cout << "Isso! Na verdade, essa idéia foi criada pela irmã de Nietzsche ";
        cout << "que era absolutamente preconceituosa e desejava ";
        cout << "a todo custo, associar a imagem dele ao antisemitismo." << endl;
    }
    cout << "--------------------------------------------------------" << endl
         << endl;
    cout << "Nietzsche acreditava em Deus?" << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "YESS!Nietzsche não acreditava no Deus criado pelo homem. ";
        cout << "O Deus que era constantemente usado para promover  ";
        cout << "guerras, dor e martírios involuntários.";
    }
    else
    {
        cout << "Resposta errada. Nietzsche sabia da distância que o homem ";
        cout << "Estava de Deus. E com isso declarou: 'O ultimo verdadeiro ";
        cout << "Cristao morreu na cruz', dentre outras declarações.";
    }

    cout << "--------------------------------------------------------------" << endl;
    cout << "Nietzsche era Niilista? " << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "Nietzsche se considerava Niilista quando partia do pressuposto ";
        cout << "que quando assumimos o nada, não estamos sozinhos.";
        cout << "Nos acompanha tambem o amor pela vontade e pela vida, acima de tudo." << endl;
    }
    else
    {
        cout << "Errado. Leia os primeiros capitulos de 'ECCE HOMO'" << endl;
    }
    return 0;
}